

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.cc
# Opt level: O3

void __thiscall
prometheus::Family<prometheus::Counter>::Family
          (Family<prometheus::Counter> *this,string *name,string *help,Labels *constant_labels)

{
  pointer pcVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  invalid_argument *piVar4;
  
  (this->super_Collectable)._vptr_Collectable = (_func_int **)&PTR__Family_0013bb50;
  (this->metrics_)._M_h._M_buckets = &(this->metrics_)._M_h._M_single_bucket;
  (this->metrics_)._M_h._M_bucket_count = 1;
  (this->metrics_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->metrics_)._M_h._M_element_count = 0;
  (this->metrics_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->metrics_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->metrics_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  (this->help_)._M_dataplus._M_p = (pointer)&(this->help_).field_2;
  pcVar1 = (help->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->help_,pcVar1,pcVar1 + help->_M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->constant_labels_)._M_t,&constant_labels->_M_t);
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  bVar2 = CheckMetricName(&this->name_);
  if (!bVar2) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid metric name");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  p_Var3 = (this->constant_labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == &(this->constant_labels_)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    bVar2 = CheckLabelName((string *)(p_Var3 + 1),Counter);
    if (!bVar2) break;
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Invalid label name");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Family<T>::Family(const std::string& name, const std::string& help,
                  const Labels& constant_labels)
    : name_(name), help_(help), constant_labels_(constant_labels) {
  if (!CheckMetricName(name_)) {
    throw std::invalid_argument("Invalid metric name");
  }
  for (auto& label_pair : constant_labels_) {
    auto& label_name = label_pair.first;
    if (!CheckLabelName(label_name, T::metric_type)) {
      throw std::invalid_argument("Invalid label name");
    }
  }
}